

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

RGBColorSpace ** __thiscall
pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Get(ThreadLocal<const_pbrt::RGBColorSpace_*> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  id args_4;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  Entry *pEVar8;
  unsigned_long *in_RDI;
  RGBColorSpace **threadLocal_1;
  RGBColorSpace *newItem;
  RGBColorSpace **threadLocal;
  size_type vb;
  int va;
  int tries;
  int step;
  uint32_t hash;
  id tid;
  Entry *in_stack_ffffffffffffff48;
  function<const_pbrt::RGBColorSpace_*()> *in_stack_ffffffffffffff50;
  char (*in_stack_ffffffffffffff98) [17];
  char (*in_stack_ffffffffffffffa0) [8];
  char *in_stack_ffffffffffffffa8;
  RGBColorSpace **ppRVar9;
  id in_stack_ffffffffffffffb0;
  id in_stack_ffffffffffffffb8;
  int iVar10;
  int iVar11;
  undefined4 in_stack_ffffffffffffffd8;
  unsigned_long *args_5;
  
  args_5 = in_RDI;
  args_4 = std::this_thread::get_id();
  sVar4 = std::hash<std::thread::id>::operator()
                    ((hash<std::thread::id> *)in_stack_ffffffffffffff50,
                     &in_stack_ffffffffffffff48->tid);
  uVar3 = (uint)sVar4;
  sVar5 = std::
          vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
          ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                  *)(in_RDI + 7));
  uVar3 = (uint)((ulong)uVar3 % sVar5);
  iVar11 = 1;
  iVar10 = 0;
  std::shared_mutex::lock_shared((shared_mutex *)0x4bbd5c);
  while( true ) {
    iVar2 = iVar10 + 1;
    iVar10 = iVar2;
    sVar5 = std::
            vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
            ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                    *)(in_RDI + 7));
    if (sVar5 <= (ulong)(long)iVar2) {
      LogFatal<char_const(&)[8],char_const(&)[17],char_const(&)[8],int&,char_const(&)[17],unsigned_long&>
                ((LogLevel)(sVar5 >> 0x20),(char *)in_stack_ffffffffffffffb8._M_thread,
                 (int)(in_stack_ffffffffffffffb0._M_thread >> 0x20),in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char (*) [8])CONCAT44(iVar11,iVar10),
                 (int *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),(char (*) [17])args_4._M_thread,
                 args_5);
    }
    pvVar6 = std::
             vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
             ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                           *)(in_RDI + 7),(ulong)uVar3);
    bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar6);
    if (bVar1) {
      std::
      vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
      ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                    *)(in_RDI + 7),(ulong)uVar3);
      in_stack_ffffffffffffffb0._M_thread = args_4._M_thread;
      pEVar8 = pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>::operator->
                         ((optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry> *)
                          0x4bbe32);
      in_stack_ffffffffffffffb8._M_thread = (pEVar8->tid)._M_thread;
      args_4._M_thread = in_stack_ffffffffffffffb0._M_thread;
      bVar1 = std::operator==(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (bVar1) {
        std::
        vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
        ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                      *)(in_RDI + 7),(ulong)uVar3);
        pEVar8 = pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>::operator->
                           ((optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry> *)
                            0x4bbe7b);
        ppRVar9 = &pEVar8->value;
        std::shared_mutex::unlock_shared((shared_mutex *)0x4bbe8e);
        return ppRVar9;
      }
    }
    pvVar6 = std::
             vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
             ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                           *)(in_RDI + 7),(ulong)uVar3);
    bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar6);
    if (!bVar1) break;
    uVar3 = iVar11 + uVar3;
    iVar11 = iVar11 + 1;
    uVar7 = (ulong)uVar3;
    sVar5 = std::
            vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
            ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                    *)(in_RDI + 7));
    if (sVar5 <= uVar7) {
      sVar5 = std::
              vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
              ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                      *)(in_RDI + 7));
      uVar3 = (uint)((ulong)uVar3 % sVar5);
    }
  }
  std::shared_mutex::unlock_shared((shared_mutex *)0x4bbed1);
  std::shared_mutex::lock((shared_mutex *)0x4bbedb);
  std::function<const_pbrt::RGBColorSpace_*()>::operator()(in_stack_ffffffffffffff50);
  pvVar6 = std::
           vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
           ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                         *)(in_RDI + 7),(ulong)uVar3);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar6);
  if (bVar1) {
    do {
      uVar3 = iVar11 + uVar3;
      iVar11 = iVar11 + 1;
      uVar7 = (ulong)uVar3;
      sVar5 = std::
              vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
              ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                      *)(in_RDI + 7));
      if (sVar5 <= uVar7) {
        sVar5 = std::
                vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                ::size((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                        *)(in_RDI + 7));
        uVar3 = (uint)((ulong)uVar3 % sVar5);
      }
      pvVar6 = std::
               vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
               ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                             *)(in_RDI + 7),(ulong)uVar3);
      bVar1 = pstd::optional::operator_cast_to_bool((optional *)pvVar6);
    } while (bVar1);
  }
  std::
  vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
  ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                *)(in_RDI + 7),(ulong)uVar3);
  pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>::operator=
            ((optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::
  vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
  ::operator[]((vector<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>,_std::allocator<pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>_>_>
                *)(in_RDI + 7),(ulong)uVar3);
  pEVar8 = pstd::optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry>::operator->
                     ((optional<pbrt::ThreadLocal<const_pbrt::RGBColorSpace_*>::Entry> *)0x4bc011);
  std::shared_mutex::unlock((shared_mutex *)0x4bc024);
  return &pEVar8->value;
}

Assistant:

inline T &ThreadLocal<T>::Get() {
    std::thread::id tid = std::this_thread::get_id();
    uint32_t hash = std::hash<std::thread::id>()(tid);
    hash %= hashTable.size();
    int step = 1;
    int tries = 0;

    mutex.lock_shared();
    while (true) {
        CHECK_LT(++tries, hashTable.size());  // full hash table

        if (hashTable[hash] && hashTable[hash]->tid == tid) {
            // Found it
            T &threadLocal = hashTable[hash]->value;
            mutex.unlock_shared();
            return threadLocal;
        } else if (!hashTable[hash]) {
            mutex.unlock_shared();

            // Get reader-writer lock before calling the callback so that the user
            // doesn't have to worry about writing a thread-safe callback.
            mutex.lock();
            T newItem = create();

            if (hashTable[hash]) {
                // someone else got there first--keep looking, but now
                // with a writer lock.
                while (true) {
                    hash += step;
                    ++step;
                    if (hash >= hashTable.size())
                        hash %= hashTable.size();

                    if (!hashTable[hash])
                        break;
                }
            }

            hashTable[hash] = Entry{tid, std::move(newItem)};
            T &threadLocal = hashTable[hash]->value;
            mutex.unlock();
            return threadLocal;
        }

        hash += step;
        ++step;
        if (hash >= hashTable.size())
            hash %= hashTable.size();
    }
}